

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_convolve_y_sr_c(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
                        InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  ushort uVar1;
  int16_t *piVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *local_58;
  ulong local_50;
  
  if (0 < h) {
    uVar1 = filter_params_y->taps;
    piVar2 = filter_params_y->filter_ptr;
    lVar4 = (long)src_stride;
    local_58 = src + (1 - (ulong)(uVar1 >> 1)) * lVar4;
    local_50 = 0;
    do {
      if (0 < w) {
        uVar8 = 0;
        pbVar5 = local_58;
        do {
          if ((ulong)filter_params_y->taps == 0) {
            iVar3 = 0;
          }
          else {
            uVar6 = 0;
            iVar3 = 0;
            pbVar7 = pbVar5;
            do {
              iVar3 = iVar3 + (uint)*pbVar7 *
                              (int)*(short *)((long)piVar2 +
                                             uVar6 * 2 +
                                             (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
              uVar6 = uVar6 + 1;
              pbVar7 = pbVar7 + lVar4;
            } while (filter_params_y->taps != uVar6);
            iVar3 = iVar3 + 0x40 >> 7;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if (0xfe < iVar3) {
            iVar3 = 0xff;
          }
          dst[uVar8 + local_50 * (long)dst_stride] = (uint8_t)iVar3;
          uVar8 = uVar8 + 1;
          pbVar5 = pbVar5 + 1;
        } while (uVar8 != (uint)w);
      }
      local_50 = local_50 + 1;
      local_58 = local_58 + lVar4;
    } while (local_50 != (uint)h);
  }
  return;
}

Assistant:

void av1_convolve_y_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                         int dst_stride, int w, int h,
                         const InterpFilterParams *filter_params_y,
                         const int subpel_y_qn) {
  const int fo_vert = filter_params_y->taps / 2 - 1;

  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      dst[y * dst_stride + x] =
          clip_pixel(ROUND_POWER_OF_TWO(res, FILTER_BITS));
    }
  }
}